

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall argo::json::json(json *this,type t)

{
  json_value *pjVar1;
  undefined1 *puVar2;
  json_exception *this_00;
  
  this->m_type = t;
  (this->m_raw_value)._M_dataplus._M_p = (pointer)&(this->m_raw_value).field_2;
  (this->m_raw_value)._M_string_length = 0;
  (this->m_raw_value).field_2._M_local_buf[0] = '\0';
  if (t < (string_e|array_e)) {
    pjVar1 = &this->m_value;
    switch(t) {
    case object_e:
      puVar2 = (undefined1 *)((long)&this->m_value + 8);
      *(undefined4 *)((long)&this->m_value + 8) = 0;
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined1 **)((long)&this->m_value + 0x18) = puVar2;
      *(undefined1 **)((long)&this->m_value + 0x20) = puVar2;
      *(undefined8 *)((long)&this->m_value + 0x28) = 0;
      break;
    case array_e:
      (pjVar1->u_array).
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      break;
    case boolean_e:
      pjVar1->u_boolean = false;
      break;
    case number_int_e:
      pjVar1->u_number_int = 0;
      break;
    case number_double_e:
      (pjVar1->u_array).
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      break;
    case string_e:
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)&this->m_value + 0x10);
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 *)((long)&this->m_value + 0x10) = 0;
    }
    return;
  }
  this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_exception::json_exception(this_00,invalid_json_type_e);
  __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
}

Assistant:

json::json(type t) : m_type(t)
{
    switch (m_type)
    {
    case object_e:
        construct_object();
        break;
    case array_e:
        construct_array();
        break;
    case string_e:
        construct_string();
        break;
    case boolean_e:
        m_value.u_boolean = false;
        break;
    case number_int_e:
        m_value.u_number_int = 0;
        break;
    case number_double_e:
        m_value.u_number_double = 0;
        break;
    case null_e:
        break;
    default:
        throw json_exception(json_exception::invalid_json_type_e);
        break;
    }
}